

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  Arena *pAVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  Arena *pAVar7;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  LogFinisher local_e1;
  ExtensionSet *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  MessageLite *pMVar6;
  
  if (message == (MessageLite *)0x0) {
    pEVar3 = FindOrNull(this,number);
    if (pEVar3 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar3);
    return;
  }
  pAVar4 = (Arena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pAVar4 & 2) == 0) {
    pAVar7 = pAVar4;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar7 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar7 = (Arena *)0x0;
  }
  if (pAVar7 != (Arena *)0x0) {
    if (((ulong)pAVar4 & 2) == 0) {
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffc);
      }
    }
    else {
      pAVar4 = (Arena *)0x0;
    }
    if (pAVar4 != this->arena_) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a6);
      pLVar5 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: message->GetOwningArena() == nullptr || message->GetOwningArena() == arena_: "
                         );
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar5);
      LogMessage::~LogMessage(&local_d8);
    }
  }
  pAVar4 = (Arena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pAVar4 & 2) == 0) {
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffc);
    }
  }
  else {
    pAVar4 = (Arena *)0x0;
  }
  local_e0 = this;
  pVar8 = Insert(this,number);
  pEVar3 = pVar8.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2b8);
      pLVar5 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar5);
      LogMessage::~LogMessage(&local_a0);
    }
    bVar1 = pEVar3->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar5 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar5);
      LogMessage::~LogMessage(&local_d8);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2b8);
      pLVar5 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_e1,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    if ((pEVar3->field_0xa & 0x10) != 0) {
      (*((pEVar3->field_0).message_value)->_vptr_MessageLite[5])
                ((pEVar3->field_0).message_value,message,local_e0->arena_);
      goto LAB_003d6efa;
    }
    if ((local_e0->arena_ == (Arena *)0x0) &&
       ((pEVar3->field_0).message_value != (MessageLite *)0x0)) {
      (*((pEVar3->field_0).message_value)->_vptr_MessageLite[1])();
    }
    if (pAVar4 == local_e0->arena_) goto LAB_003d6eca;
    if (pAVar4 != (Arena *)0x0) goto LAB_003d6eb0;
    (pEVar3->field_0).message_value = message;
    pAVar4 = local_e0->arena_;
  }
  else {
    pEVar3->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar5 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar5);
      LogMessage::~LogMessage(&local_d8);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ab);
      pLVar5 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar5);
      LogMessage::~LogMessage(&local_a0);
    }
    pEVar3->is_repeated = false;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf;
    if (pAVar4 == local_e0->arena_) {
LAB_003d6eca:
      (pEVar3->field_0).message_value = message;
      goto LAB_003d6efa;
    }
    if (pAVar4 != (Arena *)0x0) {
LAB_003d6eb0:
      iVar2 = (*message->_vptr_MessageLite[3])(message);
      pMVar6 = (MessageLite *)CONCAT44(extraout_var,iVar2);
      (pEVar3->field_0).message_value = pMVar6;
      (*pMVar6->_vptr_MessageLite[7])(pMVar6,message);
      goto LAB_003d6efa;
    }
    (pEVar3->field_0).message_value = message;
    pAVar4 = local_e0->arena_;
  }
  ThreadSafeArena::AddCleanup
            ((ThreadSafeArena *)pAVar4,message,arena_delete_object<google::protobuf::MessageLite>);
LAB_003d6efa:
  pEVar3->field_0xa = pEVar3->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  GOOGLE_DCHECK(message->GetOwningArena() == nullptr ||
         message->GetOwningArena() == arena_);
  Arena* message_arena = message->GetOwningArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == nullptr) {
      extension->message_value = message;
      arena_->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message, arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == nullptr) {
        extension->message_value = message;
        arena_->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}